

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subr0374.c
# Opt level: O0

LispPTR subr_k_trace(LispPTR *args)

{
  uint uVar1;
  DLword *local_20;
  char *base;
  int len;
  LispPTR *args_local;
  
  uVar1 = args[1];
  local_20 = NativeAligned2FromLAddr(*args);
  base._4_4_ = uVar1 & 0xffff;
  while (0 < (int)base._4_4_) {
    putc((int)(char)*local_20,_stderr);
    local_20 = (DLword *)((long)local_20 + 1);
    base._4_4_ = base._4_4_ - 1;
  }
  putc(10,_stderr);
  return 0;
}

Assistant:

LispPTR subr_k_trace(LispPTR *args) {
  int len;
  char *base;

  len = 0xFFFF & args[1];
  base = (char *)NativeAligned2FromLAddr(args[0]);
  while (len-- > 0) putc(*base++, stderr);
  putc('\n', stderr);
  return (NIL);
}